

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_function_info.cpp
# Opt level: O1

void __thiscall
duckdb::AddTableFunctionOverloadInfo::AddTableFunctionOverloadInfo
          (AddTableFunctionOverloadInfo *this,AlterEntryData *data,TableFunctionSet *new_overloads_p
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  undefined8 uVar6;
  pointer pTVar7;
  AlterEntryData local_98;
  
  paVar2 = &local_98.catalog.field_2;
  local_98.catalog._M_dataplus._M_p = (data->catalog)._M_dataplus._M_p;
  paVar1 = &(data->catalog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p == paVar1) {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.catalog.field_2._8_8_ = *(undefined8 *)((long)&(data->catalog).field_2 + 8);
    local_98.catalog._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.catalog.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.catalog._M_string_length = (data->catalog)._M_string_length;
  paVar3 = &local_98.schema.field_2;
  (data->catalog)._M_dataplus._M_p = (pointer)paVar1;
  (data->catalog)._M_string_length = 0;
  (data->catalog).field_2._M_local_buf[0] = '\0';
  local_98.schema._M_dataplus._M_p = (data->schema)._M_dataplus._M_p;
  paVar1 = &(data->schema).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p == paVar1) {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.schema.field_2._8_8_ = *(undefined8 *)((long)&(data->schema).field_2 + 8);
    local_98.schema._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_98.schema.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.schema._M_string_length = (data->schema)._M_string_length;
  paVar4 = &local_98.name.field_2;
  (data->schema)._M_dataplus._M_p = (pointer)paVar1;
  (data->schema)._M_string_length = 0;
  (data->schema).field_2._M_local_buf[0] = '\0';
  local_98.name._M_dataplus._M_p = (data->name)._M_dataplus._M_p;
  paVar1 = &(data->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p == paVar1) {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_98.name.field_2._8_8_ = *(undefined8 *)((long)&(data->name).field_2 + 8);
    local_98.name._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_98.name.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_98.name._M_string_length = (data->name)._M_string_length;
  (data->name)._M_dataplus._M_p = (pointer)paVar1;
  (data->name)._M_string_length = 0;
  (data->name).field_2._M_local_buf[0] = '\0';
  local_98.if_not_found = data->if_not_found;
  AlterTableFunctionInfo::AlterTableFunctionInfo
            (&this->super_AlterTableFunctionInfo,ADD_FUNCTION_OVERLOADS,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.name._M_dataplus._M_p != paVar4) {
    operator_delete(local_98.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.schema._M_dataplus._M_p != paVar3) {
    operator_delete(local_98.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.catalog._M_dataplus._M_p != paVar2) {
    operator_delete(local_98.catalog._M_dataplus._M_p);
  }
  (this->super_AlterTableFunctionInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AddTableFunctionOverloadInfo_02491c60;
  paVar2 = &(this->new_overloads).super_FunctionSet<duckdb::TableFunction>.name.field_2;
  (this->new_overloads).super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p =
       (pointer)paVar2;
  pcVar5 = (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).name._M_dataplus._M_p;
  paVar1 = &(new_overloads_p->super_FunctionSet<duckdb::TableFunction>).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)
             ((long)&(new_overloads_p->super_FunctionSet<duckdb::TableFunction>).name.field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)
     ((long)&(this->new_overloads).super_FunctionSet<duckdb::TableFunction>.name.field_2 + 8) =
         uVar6;
  }
  else {
    (this->new_overloads).super_FunctionSet<duckdb::TableFunction>.name._M_dataplus._M_p = pcVar5;
    (this->new_overloads).super_FunctionSet<duckdb::TableFunction>.name.field_2.
    _M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->new_overloads).super_FunctionSet<duckdb::TableFunction>.name._M_string_length =
       (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).name._M_string_length;
  (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).name._M_dataplus._M_p =
       (pointer)paVar1;
  (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).name._M_string_length = 0;
  (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).name.field_2._M_local_buf[0] = '\0';
  pTVar7 = (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).functions.
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->new_overloads).super_FunctionSet<duckdb::TableFunction>.functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_start =
       (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).functions.
       super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
       super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->new_overloads).super_FunctionSet<duckdb::TableFunction>.functions.
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data + 8) = pTVar7;
  *(pointer *)
   ((long)&(this->new_overloads).super_FunctionSet<duckdb::TableFunction>.functions.
           super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
           super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl
           .super__Vector_impl_data + 0x10) =
       (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).functions.
       super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
       super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (new_overloads_p->super_FunctionSet<duckdb::TableFunction>).functions.
  super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
  super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_AlterTableFunctionInfo).super_AlterInfo.allow_internal = true;
  return;
}

Assistant:

AddTableFunctionOverloadInfo::AddTableFunctionOverloadInfo(AlterEntryData data, TableFunctionSet new_overloads_p)
    : AlterTableFunctionInfo(AlterTableFunctionType::ADD_FUNCTION_OVERLOADS, std::move(data)),
      new_overloads(std::move(new_overloads_p)) {
	this->allow_internal = true;
}